

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCAPropBag.cpp
# Opt level: O0

HRESULT __thiscall Js::SCAPropBag::Add(SCAPropBag *this,LPCWSTR name,Var value)

{
  code *pcVar1;
  ScriptContext *this_00;
  bool bVar2;
  BOOL BVar3;
  size_t Operand;
  undefined4 *puVar4;
  void *unaff_retaddr;
  OutOfMemoryException anon_var_0;
  StackOverflowException anon_var_0_1;
  NotImplementedException anon_var_0_2;
  ScriptAbortException anon_var_0_3;
  AsmJsParseException anon_var_0_4;
  Var errorObject;
  JavascriptExceptionObject *exceptionObject;
  JavascriptException *err;
  undefined1 local_b0 [4];
  charcount_t len;
  EnterScriptObject __enterScriptObject;
  ScriptEntryExitRecord __entryExitRecord;
  ScriptContext *__localScriptContext;
  AutoHandledExceptionType local_31;
  ScriptContext *pSStack_30;
  AutoHandledExceptionType __autoHandledExceptionType;
  ScriptContext *scriptContext;
  HRESULT hr;
  Var value_local;
  LPCWSTR name_local;
  SCAPropBag *this_local;
  
  pSStack_30 = ScriptContextHolder::GetScriptContext(&this->super_ScriptContextHolder);
  AutoHandledExceptionType::AutoHandledExceptionType
            (&local_31,
             ExceptionType_JavascriptException|ExceptionType_StackOverflow|ExceptionType_OutOfMemory
            );
  this_00 = pSStack_30;
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)local_b0,pSStack_30,
             (ScriptEntryExitRecord *)&__enterScriptObject.library,unaff_retaddr,&stack0x00000000,
             false,false,false);
  ScriptContext::OnScriptStart(this_00,false,true);
  EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_b0);
  Operand = PAL_wcslen(name);
  scriptContext._4_4_ = UIntPtrToUInt(Operand,(UINT *)((long)&err + 4));
  if (-1 < scriptContext._4_4_) {
    scriptContext._4_4_ = InternalAdd(this,name,err._4_4_,value);
  }
  EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_b0);
  BVar3 = JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext();
  if (BVar3 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/SCAPropBag.cpp"
                                ,0x5d,
                                "(!JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext())",
                                "!JsUtil::ExternalApi::IsScriptActiveOnCurrentThreadContext()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  AutoHandledExceptionType::~AutoHandledExceptionType(&local_31);
  return scriptContext._4_4_;
}

Assistant:

HRESULT SCAPropBag::Add(LPCWSTR name, Var value)
    {
        HRESULT hr = S_OK;
        ScriptContext* scriptContext = GetScriptContext();

        BEGIN_TRANSLATE_EXCEPTION_AND_ERROROBJECT_TO_HRESULT
        {
            BEGIN_JS_RUNTIME_CALL_EX(scriptContext, false)
            {
                charcount_t len;
                IfFailGo(SizeTToUInt(wcslen(name), &len));
                IfFailGo(InternalAdd(name, len, value));
Error:
                ; // Fall through
            }
            END_JS_RUNTIME_CALL(scriptContext);
        }